

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::scan(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *this)

{
  bool bVar1;
  int iVar2;
  token_type tVar3;
  char *pcVar4;
  size_t length;
  char_type *literal_text;
  array<char,_4UL> null_literal;
  array<char,_4UL> true_literal;
  array<char,_5UL> false_literal;
  char_type local_20 [16];
  
  if (((this->position).chars_read_total == 0) && (bVar1 = skip_bom(this), !bVar1)) {
    pcVar4 = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
    goto LAB_0012cbb4;
  }
  do {
    get(this);
    if (0x20 < (ulong)(uint)this->current) break;
  } while ((0x100002600U >> ((ulong)(uint)this->current & 0x3f) & 1) != 0);
  iVar2 = this->current;
  if ((iVar2 == 0x2f & this->ignore_comments) == 1) {
    do {
      bVar1 = scan_comment(this);
      if (!bVar1) goto LAB_0012cbb8;
      do {
        get(this);
        if (0x20 < (ulong)(uint)this->current) break;
      } while ((0x100002600U >> ((ulong)(uint)this->current & 0x3f) & 1) != 0);
      iVar2 = this->current;
    } while ((this->ignore_comments == true) && (iVar2 == 0x2f));
  }
  if (0x5a < iVar2) {
    if (iVar2 < 0x6e) {
      if (iVar2 == 0x5b) {
        return begin_array;
      }
      if (iVar2 == 0x5d) {
        return end_array;
      }
      if (iVar2 == 0x66) {
        literal_text = local_20 + 8;
        builtin_memcpy(local_20 + 8,"false",5);
        length = 5;
        tVar3 = literal_false;
        goto LAB_0012cc5a;
      }
    }
    else if (iVar2 < 0x7b) {
      if (iVar2 == 0x6e) {
        literal_text = local_20;
        builtin_memcpy(local_20,"null",4);
        length = 4;
        tVar3 = literal_null;
LAB_0012cc5a:
        tVar3 = scan_literal(this,literal_text,length,tVar3);
        return tVar3;
      }
      if (iVar2 == 0x74) {
        literal_text = local_20 + 4;
        builtin_memcpy(local_20 + 4,"true",4);
        length = 4;
        tVar3 = literal_true;
        goto LAB_0012cc5a;
      }
    }
    else {
      if (iVar2 == 0x7b) {
        return begin_object;
      }
      if (iVar2 == 0x7d) {
        return end_object;
      }
    }
    goto switchD_0012cb5f_caseD_23;
  }
  switch(iVar2) {
  case 0x22:
    tVar3 = scan_string(this);
    return tVar3;
  case 0x2c:
    tVar3 = value_separator;
    break;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    tVar3 = scan_number(this);
    return tVar3;
  case 0x3a:
    tVar3 = name_separator;
    break;
  default:
    if (iVar2 + 1U < 2) {
      return end_of_input;
    }
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
  case 0x2f:
switchD_0012cb5f_caseD_23:
    pcVar4 = "invalid literal";
LAB_0012cbb4:
    this->error_message = pcVar4;
LAB_0012cbb8:
    tVar3 = parse_error;
  }
  return tVar3;
}

Assistant:

token_type scan()
            {
                // initially, skip the BOM
                if (position.chars_read_total == 0 && !skip_bom())
                {
                    error_message = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
                    return token_type::parse_error;
                }

                // read next character and ignore whitespace
                skip_whitespace();

                // ignore comments
                while (ignore_comments && current == '/')
                {
                    if (!scan_comment())
                    {
                        return token_type::parse_error;
                    }

                    // skip following whitespace
                    skip_whitespace();
                }

                switch (current)
                {
                    // structural characters
                case '[':
                    return token_type::begin_array;
                case ']':
                    return token_type::end_array;
                case '{':
                    return token_type::begin_object;
                case '}':
                    return token_type::end_object;
                case ':':
                    return token_type::name_separator;
                case ',':
                    return token_type::value_separator;

                    // literals
                case 't':
                {
                    std::array<char_type, 4> true_literal = { {'t', 'r', 'u', 'e'} };
                    return scan_literal(true_literal.data(), true_literal.size(), token_type::literal_true);
                }
                case 'f':
                {
                    std::array<char_type, 5> false_literal = { {'f', 'a', 'l', 's', 'e'} };
                    return scan_literal(false_literal.data(), false_literal.size(), token_type::literal_false);
                }
                case 'n':
                {
                    std::array<char_type, 4> null_literal = { {'n', 'u', 'l', 'l'} };
                    return scan_literal(null_literal.data(), null_literal.size(), token_type::literal_null);
                }

                // string
                case '\"':
                    return scan_string();

                    // number
                case '-':
                case '0':
                case '1':
                case '2':
                case '3':
                case '4':
                case '5':
                case '6':
                case '7':
                case '8':
                case '9':
                    return scan_number();

                    // end of input (the null byte is needed when parsing from
                    // string literals)
                case '\0':
                case std::char_traits<char_type>::eof():
                    return token_type::end_of_input;

                    // error
                default:
                    error_message = "invalid literal";
                    return token_type::parse_error;
                }
            }